

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArray::SetArrayLiteralItem<void*>(JavascriptArray *this,uint32 index,void *value)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  pSVar1 = (this->head).ptr;
  if (pSVar1->left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x9b6,"(segment->left == 0)","segment->left == 0");
    if (!bVar3) goto LAB_00a56fd2;
    *puVar4 = 0;
  }
  if (pSVar1->length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x9b7,"(index < segment->length)","index < segment->length");
    if (!bVar3) {
LAB_00a56fd2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            ((WriteBarrierPtr<void> *)(&pSVar1[1].left + (ulong)index * 2),value);
  return;
}

Assistant:

void JavascriptArray::SetArrayLiteralItem(uint32 index, T value)
    {
        SparseArraySegment<T> * segment = SparseArraySegment<T>::From(this->head);

        Assert(segment->left == 0);
        Assert(index < segment->length);

        segment->elements[index] = value;
    }